

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O2

bool duckdb::StructToVarcharCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  VectorType VVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  BoundCastData *pBVar10;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  child_list_t<LogicalType> *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  Vector *vector;
  reference pvVar11;
  pointer pVVar12;
  type pVVar13;
  type pVVar14;
  const_reference pvVar15;
  idx_t iVar16;
  long lVar17;
  idx_t extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar18;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  Vector *pVVar19;
  long lVar20;
  idx_t c_1;
  code *pcVar21;
  idx_t c;
  long lVar22;
  ulong uVar23;
  ulong idx;
  undefined1 auVar24 [16];
  anon_struct_16_3_d7536bce_for_pointer aVar25;
  unique_ptr<bool[],_std::default_delete<bool>,_false> value_needs_quotes;
  unique_ptr<bool[],_std::default_delete<bool>,_false> key_needs_quotes;
  string_t local_c0;
  LogicalType local_b0;
  Vector varchar_struct;
  
  VVar2 = source->vector_type;
  pBVar10 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  LogicalType::LogicalType(&local_b0,(LogicalType *)(pBVar10 + 4));
  Vector::Vector(&varchar_struct,&local_b0,count);
  LogicalType::~LogicalType(&local_b0);
  StructToStructCast(source,&varchar_struct,count,parameters);
  this = StructVector::GetEntries(source);
  Vector::Flatten(&varchar_struct,count);
  bVar7 = StructType::IsUnnamed(&source->type);
  this_00 = StructType::GetChildTypes_abi_cxx11_(&source->type);
  this_01 = StructVector::GetEntries(&varchar_struct);
  FlatVector::VerifyFlatVector(&varchar_struct);
  pdVar3 = result->data;
  key_needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (unique_ptr<bool[],_std::default_delete<bool[]>_>)
                 operator_new__((long)(this_01->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_01->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  value_needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (unique_ptr<bool[],_std::default_delete<bool[]>_>)
                 operator_new__((long)(this_01->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_01->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  cVar5 = '{';
  if (bVar7) {
    cVar5 = '(';
  }
  cVar6 = '}';
  if (bVar7) {
    cVar6 = ')';
  }
  iVar16 = extraout_RDX;
  for (idx = 0; idx != count; idx = idx + 1) {
    if ((varchar_struct.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((varchar_struct.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6]
         >> (idx & 0x3f) & 1) != 0)) {
      lVar22 = idx * 0x10;
      vector = (Vector *)0x2;
      for (uVar23 = 0;
          uVar23 < (ulong)((long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar23 = uVar23 + 1) {
        pVVar19 = (Vector *)&vector->field_0x2;
        if (uVar23 == 0) {
          pVVar19 = vector;
        }
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this,uVar23);
        pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar11);
        bVar8 = (pVVar12->type).physical_type_ - LIST;
        pcVar21 = VectorCastHelpers::CalculateEscapedStringLength<false>;
        if (bVar8 < 7) {
          pcVar21 = (code *)(&PTR_CalculateStringLength_027a94d0)[bVar8];
        }
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,uVar23);
        pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar11);
        Vector::Flatten(pVVar12,count);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,uVar23);
        pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar11);
        FlatVector::VerifyFlatVector(pVVar13);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,uVar23);
        pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar11);
        pdVar4 = pVVar14->data;
        pvVar15 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  ::get<true>(this_00,uVar23);
        if (!bVar7) {
          string_t::string_t(&local_c0,&pvVar15->first);
          iVar16 = VectorCastHelpers::CalculateEscapedStringLength<true>
                             (&local_c0,
                              (bool *)((long)key_needs_quotes.
                                             super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
                                             _M_t.
                                             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>
                                             .super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                                      uVar23));
          pVVar19 = (Vector *)(&pVVar19->field_0x2 + iVar16);
        }
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(pVVar13->validity).super_TemplatedValidityMask<unsigned_long>,idx);
        auVar24._8_8_ = extraout_RDX_00;
        auVar24._0_8_ = 4;
        if (bVar9) {
          auVar24 = (*pcVar21)(pdVar4 + lVar22,
                               (long)value_needs_quotes.
                                     super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                     super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar23);
        }
        iVar16 = auVar24._8_8_;
        vector = (Vector *)(&pVVar19->vector_type + auVar24._0_8_);
      }
      aVar25 = (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString((StringVector *)result,vector,iVar16);
      paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar3 + lVar22);
      paVar1->pointer = aVar25;
      pcVar18 = aVar25.ptr;
      if (aVar25.length < 0xd) {
        pcVar18 = (paVar1->pointer).prefix;
      }
      *pcVar18 = cVar5;
      lVar20 = 1;
      for (uVar23 = 0;
          uVar23 < (ulong)((long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar23 = uVar23 + 1) {
        if (uVar23 != 0) {
          (pcVar18 + lVar20)[0] = ',';
          (pcVar18 + lVar20)[1] = ' ';
          lVar20 = lVar20 + 2;
        }
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this,uVar23);
        pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar11);
        bVar8 = (pVVar12->type).physical_type_ - LIST;
        pcVar21 = VectorCastHelpers::WriteEscapedString<false>;
        if (bVar8 < 7) {
          pcVar21 = (code *)(&PTR_WriteString_027a9508)[bVar8];
        }
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,uVar23);
        pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar11);
        FlatVector::VerifyFlatVector(pVVar13);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,uVar23);
        pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar11);
        pdVar4 = pVVar14->data;
        if (!bVar7) {
          pvVar15 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ::get<true>(this_00,uVar23);
          string_t::string_t(&local_c0,&pvVar15->first);
          iVar16 = VectorCastHelpers::WriteEscapedString<true>
                             (pcVar18 + lVar20,&local_c0,
                              *(bool *)((long)key_needs_quotes.
                                              super_unique_ptr<bool[],_std::default_delete<bool[]>_>
                                              ._M_t.
                                              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>
                                              .super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                                       uVar23));
          (pcVar18 + iVar16 + lVar20)[0] = ':';
          (pcVar18 + iVar16 + lVar20)[1] = ' ';
          lVar20 = lVar20 + iVar16 + 2;
        }
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(pVVar13->validity).super_TemplatedValidityMask<unsigned_long>,idx);
        if (bVar9) {
          lVar17 = (*pcVar21)(pcVar18 + lVar20,pdVar4 + lVar22,
                              *(undefined1 *)
                               ((long)value_needs_quotes.
                                      super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                                      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t
                                      .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                      super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar23));
        }
        else {
          builtin_strncpy(pcVar18 + lVar20,"NULL",4);
          lVar17 = 4;
        }
        lVar20 = lVar20 + lVar17;
      }
      pcVar18[lVar20] = cVar6;
      string_t::Finalize((string_t *)(pdVar3 + lVar22));
      iVar16 = extraout_RDX_01;
    }
    else {
      FlatVector::SetNull(result,idx,true);
      iVar16 = extraout_RDX_02;
    }
  }
  if (VVar2 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&value_needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>);
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&key_needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>);
  Vector::~Vector(&varchar_struct);
  return true;
}

Assistant:

static bool StructToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// first cast all child elements to varchar
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	Vector varchar_struct(cast_data.target, count);
	StructToStructCast(source, varchar_struct, count, parameters);
	auto &base_children = StructVector::GetEntries(source);

	// now construct the actual varchar vector
	varchar_struct.Flatten(count);
	bool is_unnamed = StructType::IsUnnamed(source.GetType());
	auto &child_types = StructType::GetChildTypes(source.GetType());
	auto &children = StructVector::GetEntries(varchar_struct);
	auto &validity = FlatVector::Validity(varchar_struct);
	auto result_data = FlatVector::GetData<string_t>(result);
	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NAME_SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;
	auto key_needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(children.size());
	auto value_needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(children.size());

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		//! Calculate the total length of the row
		idx_t string_length = 2; // {}
		for (idx_t c = 0; c < children.size(); c++) {
			if (c > 0) {
				string_length += SEP_LENGTH;
			}
			auto add_escapes = !base_children[c]->GetType().IsNested();
			auto string_length_func = add_escapes ? VectorCastHelpers::CalculateEscapedStringLength<false>
			                                      : VectorCastHelpers::CalculateStringLength;

			children[c]->Flatten(count);
			auto &child_validity = FlatVector::Validity(*children[c]);
			auto data = FlatVector::GetData<string_t>(*children[c]);
			auto &name = child_types[c].first;
			if (!is_unnamed) {
				string_length += VectorCastHelpers::CalculateEscapedStringLength<true>(name, key_needs_quotes[c]);
				string_length += NAME_SEP_LENGTH; // ": "
			}
			if (child_validity.RowIsValid(i)) {
				//! Skip the `\`, not a special character outside quotes
				string_length += string_length_func(data[i], value_needs_quotes[c]);
			} else {
				string_length += NULL_LENGTH;
			}
		}

		result_data[i] = StringVector::EmptyString(result, string_length);
		auto dataptr = result_data[i].GetDataWriteable();

		//! Serialize the struct to the string
		idx_t offset = 0;
		dataptr[offset++] = is_unnamed ? '(' : '{';
		for (idx_t c = 0; c < children.size(); c++) {
			if (c > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			auto add_escapes = !base_children[c]->GetType().IsNested();
			auto write_string_func =
			    add_escapes ? VectorCastHelpers::WriteEscapedString<false> : VectorCastHelpers::WriteString;

			auto &child_validity = FlatVector::Validity(*children[c]);
			auto data = FlatVector::GetData<string_t>(*children[c]);
			if (!is_unnamed) {
				auto &name = child_types[c].first;
				// "{<name>: <value>}"
				offset += VectorCastHelpers::WriteEscapedString<true>(dataptr + offset, name, key_needs_quotes[c]);
				dataptr[offset++] = ':';
				dataptr[offset++] = ' ';
			}
			// value
			if (child_validity.RowIsValid(i)) {
				//! Skip the `\`, not a special character outside quotes
				offset += write_string_func(dataptr + offset, data[i], value_needs_quotes[c]);
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset++] = is_unnamed ? ')' : '}';
		result_data[i].Finalize();
	}

	if (constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	return true;
}